

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

void Bmc_MnaBuild_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Man_t *pNew,Vec_Int_t *vMap,Vec_Int_t *vPiMap
                     )

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar7 = *(ulong *)pObj;
  if ((long)uVar7 < 0) {
    uVar5 = uVar7 & 0x7fffffffffffffff;
    *(ulong *)pObj = uVar5;
    if (pObj->Value != 3) {
      __assert_fail("pObj->Value == GIA_UND",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,0xe9,
                    "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    uVar4 = (uint)uVar7;
    uVar8 = uVar7 & 0x1fffffff;
    if (uVar8 == 0x1fffffff || (int)uVar4 < 0) {
      if ((uVar4 & 0x9fffffff) != 0x9fffffff) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                      ,0xfe,
                      "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      uVar9 = (uint)(uVar7 >> 0x20) & 0x1fffffff;
      if (p->vCis->nSize - p->nRegs <= (int)uVar9) {
        pGVar1 = p->pObjs;
        if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_005174c9;
        uVar4 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
        if ((-1 < (int)uVar4) && ((int)uVar4 < vMap->nSize)) {
          if (vMap->pArray[uVar4 & 0x7fffffff] != -1) {
            return;
          }
          __assert_fail("Vec_IntEntry(vMap, Gia_ObjId(p, pObj)) != -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                        ,0xf8,
                        "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
LAB_005174e8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (-1 < (int)uVar4) {
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
      }
      Vec_IntPush(vPiMap,uVar9);
      pGVar1 = p->pObjs;
      if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_005174c9;
      pGVar6 = Gia_ManAppendObj(pNew);
      uVar7 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar7 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar7 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = pNew->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar6)) goto LAB_005174c9;
      Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = pNew->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar6)) goto LAB_005174c9;
      uVar10 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
      if (((int)uVar10 < 0) || (vMap->nSize <= (int)uVar10)) goto LAB_00517507;
      iVar3 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
    }
    else {
      if (pObj[-uVar8].Value == 3) {
        Bmc_MnaBuild_rec(p,pObj + -uVar8,pNew,vMap,vPiMap);
        uVar5 = *(ulong *)pObj;
      }
      uVar7 = (ulong)((uint)(uVar5 >> 0x20) & 0x1fffffff);
      if (pObj[-uVar7].Value == 3) {
        Bmc_MnaBuild_rec(p,pObj + -uVar7,pNew,vMap,vPiMap);
        uVar5 = *(ulong *)pObj;
      }
      uVar4 = 1;
      uVar9 = 1;
      if (pObj[-(ulong)((uint)uVar5 & 0x1fffffff)].Value == 3) {
        pGVar1 = p->pObjs;
        if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_005174c9;
        uVar9 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555 -
                ((uint)uVar5 & 0x1fffffff);
        if (((int)uVar9 < 0) || (vMap->nSize <= (int)uVar9)) goto LAB_005174e8;
        if (vMap->pArray[uVar9] < 0) goto LAB_00517564;
        uVar9 = vMap->pArray[uVar9] ^ (uint)(uVar5 >> 0x1d) & 1;
      }
      uVar10 = (uint)(uVar5 >> 0x20);
      pGVar1 = p->pObjs;
      if (pObj[-(ulong)(uVar10 & 0x1fffffff)].Value == 3) {
        if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_005174c9;
        uVar4 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555 - (uVar10 & 0x1fffffff)
        ;
        if (((int)uVar4 < 0) || (vMap->nSize <= (int)uVar4)) goto LAB_005174e8;
        if (vMap->pArray[uVar4] < 0) {
LAB_00517564:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf5,"int Abc_LitNotCond(int, int)");
        }
        uVar4 = vMap->pArray[uVar4] ^ uVar10 >> 0x1d & 1;
      }
      if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
LAB_005174c9:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar10 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
      iVar3 = Gia_ManHashAnd(pNew,uVar9,uVar4);
      if (((int)uVar10 < 0) || (vMap->nSize <= (int)uVar10)) {
LAB_00517507:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
    }
    vMap->pArray[uVar10 & 0x7fffffff] = iVar3;
  }
  return;
}

Assistant:

void Bmc_MnaBuild_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Man_t * pNew, Vec_Int_t * vMap, Vec_Int_t * vPiMap )
{
    if ( !pObj->fPhase )
        return;
    pObj->fPhase = 0;
    assert( pObj->Value == GIA_UND );
    if ( Gia_ObjIsAnd(pObj) )
    {
        int iLit0 = 1, iLit1 = 1;
        if ( Gia_ObjFanin0(pObj)->Value == GIA_UND )
            Bmc_MnaBuild_rec( p, Gia_ObjFanin0(pObj), pNew, vMap, vPiMap );
        if ( Gia_ObjFanin1(pObj)->Value == GIA_UND )
            Bmc_MnaBuild_rec( p, Gia_ObjFanin1(pObj), pNew, vMap, vPiMap );
        if ( Gia_ObjFanin0(pObj)->Value == GIA_UND )
            iLit0 = Abc_LitNotCond( Vec_IntEntry(vMap, Gia_ObjFaninId0p(p, pObj)), Gia_ObjFaninC0(pObj) );
        if ( Gia_ObjFanin1(pObj)->Value == GIA_UND )
            iLit1 = Abc_LitNotCond( Vec_IntEntry(vMap, Gia_ObjFaninId1p(p, pObj)), Gia_ObjFaninC1(pObj) );
        Vec_IntWriteEntry( vMap, Gia_ObjId(p, pObj), Gia_ManHashAnd(pNew, iLit0, iLit1) );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        assert( Vec_IntEntry(vMap, Gia_ObjId(p, pObj)) != -1 );
    else if ( Gia_ObjIsPi(p, pObj) )
    {
        Vec_IntPush( vPiMap, Gia_ObjCioId(pObj) );
        Vec_IntWriteEntry( vMap, Gia_ObjId(p, pObj), Gia_ManAppendCi(pNew) );
    }
    else assert( 0 );
}